

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::type_caster_generic::src_and_type
          (void *src,type_info *cast_type,type_info *rtti_type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *local_b8;
  void *local_b0;
  void *local_a8;
  string local_a0 [8];
  string msg;
  allocator local_69;
  string local_68 [8];
  string tname;
  type_info *local_48;
  type_index local_40;
  type_info *local_38;
  type_info *tpi;
  type_info *rtti_type_local;
  type_info *cast_type_local;
  void *src_local;
  
  tpi = (type_info *)rtti_type;
  rtti_type_local = cast_type;
  cast_type_local = (type_info *)src;
  std::type_index::type_index(&local_40,cast_type);
  local_48 = get_type_info(&local_40,false);
  local_38 = local_48;
  if (local_48 == (type_info *)0x0) {
    if (tpi == (type_info *)0x0) {
      local_b8 = std::type_info::name(rtti_type_local);
    }
    else {
      local_b8 = std::type_info::name((type_info *)tpi);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,local_b8,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    clean_type_id((string *)local_68);
    std::operator+((char *)local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unregistered type : ");
    uVar1 = _PyExc_TypeError;
    uVar2 = std::__cxx11::string::c_str();
    PyErr_SetString(uVar1,uVar2);
    local_a8 = (void *)0x0;
    local_b0 = (void *)0x0;
    std::pair<const_void_*,_const_pybind11::detail::type_info_*>::
    pair<std::nullptr_t,_std::nullptr_t,_true>
              ((pair<const_void_*,_const_pybind11::detail::type_info_*> *)&src_local,&local_a8,
               &local_b0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_68);
  }
  else {
    std::pair<const_void_*,_const_pybind11::detail::type_info_*>::
    pair<const_void_*&,_const_pybind11::detail::type_info_*,_true>
              ((pair<const_void_*,_const_pybind11::detail::type_info_*> *)&src_local,
               &cast_type_local,&local_48);
  }
  return _src_local;
}

Assistant:

PYBIND11_NOINLINE static std::pair<const void *, const type_info *> src_and_type(
            const void *src, const std::type_info &cast_type, const std::type_info *rtti_type = nullptr) {
        if (auto *tpi = get_type_info(cast_type))
            return {src, const_cast<const type_info *>(tpi)};

        // Not found, set error:
        std::string tname = rtti_type ? rtti_type->name() : cast_type.name();
        detail::clean_type_id(tname);
        std::string msg = "Unregistered type : " + tname;
        PyErr_SetString(PyExc_TypeError, msg.c_str());
        return {nullptr, nullptr};
    }